

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

tuple<baryonyx::problem,_baryonyx::problem> *
baryonyx::split(tuple<baryonyx::problem,_baryonyx::problem> *__return_storage_ptr__,context *ctx,
               problem *pb,int variable_index_to_affect)

{
  pointer pbVar1;
  size_t size;
  tuple<double,_baryonyx::show_size_type> *mem;
  baryonyx local_310 [16];
  problem local_300;
  preprocessor<baryonyx::problem> pp;
  problem local_128;
  
  if ((-1 < variable_index_to_affect) &&
     (variable_index_to_affect <
      (int)(((long)(pb->vars).values.
                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pb->vars).values.
                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0xc))) {
    pbVar1 = (pb->vars).names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    size = memory_consumed(pb);
    memory_consumed_size<unsigned_long>(size);
    to_string_abi_cxx11_((string *)&local_300,local_310,mem);
    info<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (ctx,"  - Preprocessor starts split of variable {} (size: {})\n",
               pbVar1 + (uint)variable_index_to_affect,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    anon_unknown.dwarf_eaf21::preprocessor<baryonyx::problem>::preprocessor(&pp,ctx,pb);
    anon_unknown.dwarf_eaf21::preprocessor<baryonyx::problem>::operator()
              (&local_300,&pp,variable_index_to_affect,true);
    anon_unknown.dwarf_eaf21::preprocessor<baryonyx::problem>::operator()
              (&local_128,&pp,variable_index_to_affect,false);
    std::tuple<baryonyx::problem,_baryonyx::problem>::
    tuple<baryonyx::problem,_baryonyx::problem,_true>(__return_storage_ptr__,&local_300,&local_128);
    problem::~problem(&local_128);
    problem::~problem(&local_300);
    anon_unknown.dwarf_eaf21::preprocessor<baryonyx::problem>::~preprocessor(&pp);
    return __return_storage_ptr__;
  }
  details::fail_fast("Precondition",
                     "variable_index_to_affect >= 0 && variable_index_to_affect < length(pb.vars.values)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                     ,"870");
}

Assistant:

std::tuple<problem, problem>
split(const context& ctx, const problem& pb, int variable_index_to_affect)
{
    bx_expects(variable_index_to_affect >= 0 &&
               variable_index_to_affect < length(pb.vars.values));

    info(ctx,
         "  - Preprocessor starts split of variable {} (size: {})\n",
         pb.vars.names[variable_index_to_affect],
         to_string(memory_consumed_size(memory_consumed(pb))));

    ::preprocessor<problem> pp(ctx, pb);

    return std::make_tuple(pp(variable_index_to_affect, true),
                           pp(variable_index_to_affect, false));
}